

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isLinearCompareResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord
               ,int coordZ,float cmpReference,float result)

{
  int size;
  int size_00;
  int c;
  bool isFixedPointDepth;
  bool bVar1;
  bool bVar2;
  uint c_00;
  int i;
  int i_00;
  int j;
  int j_00;
  int iVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec2 vBounds;
  Vec2 uBounds;
  Vec4 depths;
  Vec2 local_b8;
  Vec2 local_b0;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  Vec4 local_98;
  ulong local_88;
  TexComparePrecision *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  isFixedPointDepth = isFixedPointDepthTextureFormat(&level->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_a0,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],*(int *)prec,*(int *)(prec + 0xc));
  local_80 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_a8,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],*(int *)(prec + 4),*(int *)(prec + 0x10));
  fVar5 = floorf(local_a0 + -0.5);
  fVar6 = floorf(local_9c + -0.5);
  fVar7 = floorf(local_a8 + -0.5);
  uVar4 = (uint)fVar7;
  fVar7 = floorf(local_a4 + -0.5);
  iVar3 = (int)fVar7;
  bVar2 = (int)uVar4 <= iVar3;
  if ((int)uVar4 <= iVar3) {
    size = (level->m_size).m_data[0];
    size_00 = (level->m_size).m_data[1];
    do {
      local_88 = (ulong)uVar4;
      c_00 = uVar4 + 1;
      c = (int)fVar5;
      while (c <= (int)fVar6) {
        i = TexVerifierUtil::wrap(sampler->wrapS,c,size);
        i_00 = TexVerifierUtil::wrap(sampler->wrapS,c + 1,size);
        j = TexVerifierUtil::wrap(sampler->wrapT,(int)local_88,size_00);
        j_00 = TexVerifierUtil::wrap(sampler->wrapT,c_00,size_00);
        fVar9 = (local_a0 + -0.5) - (float)c;
        fVar7 = 1.0;
        if (fVar9 <= 1.0) {
          fVar7 = fVar9;
        }
        local_48 = ZEXT416(~-(uint)(fVar9 < 0.0) & (uint)fVar7);
        fVar9 = (local_9c + -0.5) - (float)c;
        fVar7 = 1.0;
        if (fVar9 <= 1.0) {
          fVar7 = fVar9;
        }
        local_58 = ZEXT416(~-(uint)(fVar9 < 0.0) & (uint)fVar7);
        fVar9 = (local_a8 + -0.5) - (float)(int)uVar4;
        fVar7 = 1.0;
        if (fVar9 <= 1.0) {
          fVar7 = fVar9;
        }
        local_68 = ZEXT416(~-(uint)(fVar9 < 0.0) & (uint)fVar7);
        fVar9 = (local_a4 + -0.5) - (float)(int)uVar4;
        fVar7 = 1.0;
        if (fVar9 <= 1.0) {
          fVar7 = fVar9;
        }
        local_78 = ZEXT416(~-(uint)(fVar9 < 0.0) & (uint)fVar7);
        fVar7 = lookupDepth(level,sampler,i,j,coordZ);
        fVar9 = lookupDepth(level,sampler,i_00,j,coordZ);
        fVar8 = lookupDepth(level,sampler,i,j_00,coordZ);
        local_98.m_data[3] = lookupDepth(level,sampler,i_00,j_00,coordZ);
        local_b0.m_data[0] = (float)local_48._0_4_;
        local_b0.m_data[1] = (float)local_58._0_4_;
        local_b8.m_data[0] = (float)local_68._0_4_;
        local_b8.m_data[1] = (float)local_78._0_4_;
        local_98.m_data[0] = fVar7;
        local_98.m_data[1] = fVar9;
        local_98.m_data[2] = fVar8;
        bVar1 = isBilinearCompareValid
                          (sampler->compare,local_80,&local_98,&local_b0,&local_b8,cmpReference,
                           result,isFixedPointDepth);
        c = c + 1;
        if (bVar1) {
          return bVar2;
        }
      }
      bVar2 = (int)c_00 <= iVar3;
      uVar4 = c_00;
    } while ((int)c_00 <= iVar3);
  }
  return bVar2;
}

Assistant:

static bool isLinearCompareResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const TexComparePrecision&			prec,
										const Vec2&							coord,
										const int							coordZ,
										const float							cmpReference,
										const float							result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			const Vec4	depths	(lookupDepth(level, sampler, x0, y0, coordZ),
								 lookupDepth(level, sampler, x1, y0, coordZ),
								 lookupDepth(level, sampler, x0, y1, coordZ),
								 lookupDepth(level, sampler, x1, y1, coordZ));

			if (isBilinearCompareValid(sampler.compare, prec, depths, Vec2(minA, maxA), Vec2(minB, maxB), cmpReference, result, isFixedPointDepth))
				return true;
		}
	}

	return false;
}